

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O0

void fft_r2c_exec(fft_real_object obj,double *inp,fft_data *oup)

{
  int iVar1;
  fft_data *inp_00;
  fft_data *oup_00;
  double dVar2;
  double dVar3;
  double temp2;
  double temp1;
  int N;
  int N2;
  int i;
  fft_data *coup;
  fft_data *cinp;
  fft_data *oup_local;
  double *inp_local;
  fft_real_object obj_local;
  
  iVar1 = obj->cobj->N;
  inp_00 = (fft_data *)malloc((long)iVar1 << 4);
  oup_00 = (fft_data *)malloc((long)iVar1 << 4);
  for (N = 0; N < iVar1; N = N + 1) {
    inp_00[N].re = inp[N << 1];
    inp_00[N].im = inp[N * 2 + 1];
  }
  fft_exec(obj->cobj,inp_00,oup_00);
  oup->re = oup_00->re + oup_00->im;
  oup->im = 0.0;
  for (N = 1; N < iVar1; N = N + 1) {
    dVar2 = oup_00[N].im + oup_00[iVar1 - N].im;
    dVar3 = oup_00[iVar1 - N].re - oup_00[N].re;
    oup[N].re = (dVar3 * obj->twiddle2[N].im +
                dVar2 * obj->twiddle2[N].re + oup_00[N].re + oup_00[iVar1 - N].re) / 2.0;
    oup[N].im = (-dVar2 * obj->twiddle2[N].im +
                dVar3 * obj->twiddle2[N].re + (oup_00[N].im - oup_00[iVar1 - N].im)) / 2.0;
  }
  oup[iVar1].re = oup_00->re - oup_00->im;
  oup[iVar1].im = 0.0;
  for (N = 1; N < iVar1; N = N + 1) {
    oup[iVar1 * 2 - N].re = oup[N].re;
    oup[iVar1 * 2 - N].im = -oup[N].im;
  }
  free(inp_00);
  free(oup_00);
  return;
}

Assistant:

void fft_r2c_exec(fft_real_object obj,fft_type *inp,fft_data *oup) {
	fft_data* cinp;
	fft_data* coup;
	int i,N2,N;
	fft_type temp1,temp2;
	N2 = obj->cobj->N;
	N = N2*2;
	
	cinp = (fft_data*) malloc (sizeof(fft_data) * N2);
	coup = (fft_data*) malloc (sizeof(fft_data) * N2);
	
	for (i = 0; i < N2; ++i) {
		cinp[i].re = inp[2*i];
		cinp[i].im = inp[2*i+1];
	}
	
	fft_exec(obj->cobj,cinp,coup);
	
	oup[0].re = coup[0].re + coup[0].im;
	oup[0].im = 0.0;
	
	for (i = 1; i < N2; ++i) {
		temp1 = coup[i].im + coup[N2-i].im ;
		temp2 = coup[N2-i].re - coup[i].re ;
		oup[i].re = (coup[i].re + coup[N2-i].re + (temp1 * obj->twiddle2[i].re) + (temp2 * obj->twiddle2[i].im)) / 2.0;
		oup[i].im = (coup[i].im - coup[N2-i].im + (temp2 * obj->twiddle2[i].re) - (temp1 * obj->twiddle2[i].im)) / 2.0;
	}
	
	
	
	oup[N2].re = coup[0].re - coup[0].im;
	oup[N2].im = 0.0;
	
	for (i = 1; i < N2;++i) {
		oup[N-i].re = oup[i].re; 
		oup[N-i].im = -oup[i].im; 
	}
	
		
	free(cinp);
	free(coup);

}